

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O1

void __thiscall QNetworkRequestFactory::setBaseUrl(QNetworkRequestFactory *this,QUrl *url)

{
  QNetworkRequestFactoryPrivate *pQVar1;
  char cVar2;
  
  cVar2 = comparesEqual(&((this->d).d.ptr)->baseUrl,url);
  if (cVar2 != '\0') {
    return;
  }
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QNetworkRequestFactoryPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach_helper(&this->d);
  }
  QUrl::operator=(&((this->d).d.ptr)->baseUrl,url);
  return;
}

Assistant:

void QNetworkRequestFactory::setBaseUrl(const QUrl &url)
{
    if (d->baseUrl == url)
        return;

    d.detach();
    d->baseUrl = url;
}